

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * getLinkedTargetsContent<cmLinkImplItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  cmGeneratorTarget *pcVar1;
  string *__rhs;
  cmLocalGenerator *lg;
  pointer pcVar2;
  string depString;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  for (pcVar2 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pcVar2 != (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
                _M_impl.super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
    pcVar1 = (pcVar2->super_cmLinkItem).Target;
    if (pcVar1 != target && pcVar1 != (cmGeneratorTarget *)0x0) {
      std::operator+(&local_a8,&local_c8,"$<TARGET_PROPERTY:");
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_((pcVar2->super_cmLinkItem).Target);
      std::operator+(&local_88,&local_a8,__rhs);
      std::operator+(&local_48,&local_88,",");
      std::operator+(&local_68,&local_48,interfacePropertyName);
      std::operator+(&local_108,&local_68,">");
      std::__cxx11::string::append((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::assign((char *)&local_c8);
    }
  }
  if (local_e8._M_string_length != 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_108,&local_e8,lg,context,headTarget,target,dagChecker);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  cmGeneratorExpression::StripEmptyListElements(&local_108,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target) {
      depString += sep + "$<TARGET_PROPERTY:" + it->Target->GetName() + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}